

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O0

bool axl::io::isSockAddrMatch(sockaddr *addr,sockaddr *filterAddr)

{
  sockaddr_in6 *in_RSI;
  sockaddr_in6 *in_RDI;
  bool local_1f;
  bool local_1e;
  bool local_1d;
  bool local_1;
  
  if (in_RSI->sin6_family == 2) {
    if ((in_RSI->sin6_flowinfo != 0) || (local_1d = true, in_RDI->sin6_port != in_RSI->sin6_port)) {
      local_1e = false;
      if (in_RDI->sin6_family == 2) {
        local_1e = isSockAddrMatch_ip4((sockaddr_in *)in_RDI,(sockaddr_in *)in_RSI);
      }
      local_1d = local_1e;
    }
    local_1 = local_1d;
  }
  else if (in_RSI->sin6_family == 10) {
    local_1f = false;
    if (in_RDI->sin6_family == 10) {
      local_1f = isSockAddrMatch_ip6(in_RDI,in_RSI);
    }
    local_1 = local_1f;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
isSockAddrMatch(
	const sockaddr* addr,
	const sockaddr* filterAddr
) {
	switch (filterAddr->sa_family) {
	case AF_INET:
		return
			*(const uint32_t*)&((const sockaddr_in*)filterAddr)->sin_addr == 0 &&
			((const sockaddr_in*)addr)->sin_port == ((const sockaddr_in*)filterAddr)->sin_port ||
			addr->sa_family == AF_INET &&
			isSockAddrMatch_ip4((const sockaddr_in*)addr, (const sockaddr_in*)filterAddr);

	case AF_INET6:
		return
			addr->sa_family == AF_INET6 &&
			isSockAddrMatch_ip6((const sockaddr_in6*)addr, (const sockaddr_in6*)filterAddr);

	default:
		return false;
	}
}